

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_wad.cpp
# Opt level: O0

void __thiscall FWadFile::SkinHack(FWadFile *this)

{
  FWadFileLump *pFVar1;
  bool bVar2;
  bool bVar3;
  uint local_24;
  DWORD j;
  FResourceLump *lump;
  DWORD i;
  bool hasmap;
  bool skinned;
  FWadFile *this_local;
  
  bVar2 = false;
  bVar3 = false;
  for (lump._0_4_ = 0; (uint)lump < (this->super_FResourceFile).NumLumps;
      lump._0_4_ = (uint)lump + 1) {
    pFVar1 = this->Lumps;
    if ((((pFVar1[(uint)lump].super_FResourceLump.field_3.Name[0] == 'S') &&
         (pFVar1[(uint)lump].super_FResourceLump.field_3.Name[1] == '_')) &&
        (pFVar1[(uint)lump].super_FResourceLump.field_3.Name[2] == 'S')) &&
       (((pFVar1[(uint)lump].super_FResourceLump.field_3.Name[3] == 'K' &&
         (pFVar1[(uint)lump].super_FResourceLump.field_3.Name[4] == 'I')) &&
        (pFVar1[(uint)lump].super_FResourceLump.field_3.Name[5] == 'N')))) {
      pFVar1[(uint)lump].super_FResourceLump.field_3.Name[7] = '\0';
      pFVar1[(uint)lump].super_FResourceLump.field_3.Name[6] = '\0';
      if (!bVar2) {
        bVar2 = true;
        for (local_24 = 0; local_24 < (this->super_FResourceFile).NumLumps; local_24 = local_24 + 1)
        {
          this->Lumps[local_24].super_FResourceLump.Namespace = SkinHack::namespc;
        }
        SkinHack::namespc = SkinHack::namespc + 1;
      }
    }
    if ((((pFVar1[(uint)lump].super_FResourceLump.field_3.Name[0] == 'M') &&
         (pFVar1[(uint)lump].super_FResourceLump.field_3.Name[1] == 'A')) &&
        ((pFVar1[(uint)lump].super_FResourceLump.field_3.Name[2] == 'P' &&
         (((('/' < pFVar1[(uint)lump].super_FResourceLump.field_3.Name[3] &&
            (pFVar1[(uint)lump].super_FResourceLump.field_3.Name[3] < ':')) &&
           ('/' < pFVar1[(uint)lump].super_FResourceLump.field_3.Name[4])) &&
          ((pFVar1[(uint)lump].super_FResourceLump.field_3.Name[4] < ':' &&
           (-1 < pFVar1[(uint)lump].super_FResourceLump.field_3.Name[5])))))))) ||
       (((pFVar1[(uint)lump].super_FResourceLump.field_3.Name[0] == 'E' &&
         (('/' < pFVar1[(uint)lump].super_FResourceLump.field_3.Name[1] &&
          (pFVar1[(uint)lump].super_FResourceLump.field_3.Name[1] < ':')))) &&
        ((pFVar1[(uint)lump].super_FResourceLump.field_3.Name[2] == 'M' &&
         ((('/' < pFVar1[(uint)lump].super_FResourceLump.field_3.Name[3] &&
           (pFVar1[(uint)lump].super_FResourceLump.field_3.Name[3] < ':')) &&
          (-1 < pFVar1[(uint)lump].super_FResourceLump.field_3.Name[4])))))))) {
      bVar3 = true;
    }
  }
  if ((bVar2) && (bVar3)) {
    Printf("\x1cHThe maps in %s will not be loaded because it has a skin.\n\x1cHYou should remove the skin from the wad to play these maps.\n"
           ,(this->super_FResourceFile).Filename);
  }
  return;
}

Assistant:

void FWadFile::SkinHack ()
{
	static int namespc = ns_firstskin;
	bool skinned = false;
	bool hasmap = false;
	DWORD i;

	for (i = 0; i < NumLumps; i++)
	{
		FResourceLump *lump = &Lumps[i];

		if (lump->Name[0] == 'S' &&
			lump->Name[1] == '_' &&
			lump->Name[2] == 'S' &&
			lump->Name[3] == 'K' &&
			lump->Name[4] == 'I' &&
			lump->Name[5] == 'N')
		{ // Wad has at least one skin.
			lump->Name[6] = lump->Name[7] = 0;
			if (!skinned)
			{
				skinned = true;
				DWORD j;

				for (j = 0; j < NumLumps; j++)
				{
					Lumps[j].Namespace = namespc;
				}
				namespc++;
			}
		}
		if ((lump->Name[0] == 'M' &&
			 lump->Name[1] == 'A' &&
			 lump->Name[2] == 'P' &&
			 lump->Name[3] >= '0' && lump->Name[3] <= '9' &&
			 lump->Name[4] >= '0' && lump->Name[4] <= '9' &&
			 lump->Name[5] >= '\0')
			||
			(lump->Name[0] == 'E' &&
			 lump->Name[1] >= '0' && lump->Name[1] <= '9' &&
			 lump->Name[2] == 'M' &&
			 lump->Name[3] >= '0' && lump->Name[3] <= '9' &&
			 lump->Name[4] >= '\0'))
		{
			hasmap = true;
		}
	}
	if (skinned && hasmap)
	{
		Printf (TEXTCOLOR_BLUE
			"The maps in %s will not be loaded because it has a skin.\n"
			TEXTCOLOR_BLUE
			"You should remove the skin from the wad to play these maps.\n",
			Filename);
	}
}